

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

format_decimal_result<char_*> __thiscall
fmt::v8::detail::format_decimal<char,unsigned__int128>
          (detail *this,char *out,unsigned___int128 value,int size)

{
  int iVar1;
  undefined8 in_RAX;
  int in_ECX;
  undefined4 in_register_00000014;
  ulong uVar2;
  undefined8 unaff_RBX;
  detail *pdVar3;
  detail *pdVar4;
  undefined1 auVar5 [16];
  format_decimal_result<char_*> fVar6;
  
  uVar2 = CONCAT44(in_register_00000014,size);
  auVar5._8_8_ = unaff_RBX;
  auVar5._0_8_ = in_RAX;
  iVar1 = count_digits_fallback<unsigned__int128>((detail *)out,(unsigned___int128)auVar5);
  if (iVar1 <= in_ECX) {
    pdVar4 = this + in_ECX;
    while (pdVar3 = pdVar4 + -2, (out < (char *)0x64) <= uVar2) {
      auVar5 = __udivti3(out,uVar2,100,0);
      *(undefined2 *)pdVar3 =
           *(undefined2 *)
            (
            "00010203040506070809101112131415161718192021222324252627282930313233343536373839404142434445464748495051525354555657585960616263646566676869707172737475767778798081828384858687888990919293949596979899"
            + (long)(out + (long)auVar5._0_8_ * -100) * 2);
      out = auVar5._0_8_;
      pdVar4 = pdVar3;
      uVar2 = auVar5._8_8_;
    }
    if (uVar2 == 0 && (ulong)((char *)0x9 < out) <= -uVar2) {
      pdVar4[-1] = (detail)((byte)out | 0x30);
      pdVar3 = pdVar4 + -1;
    }
    else {
      *(undefined2 *)pdVar3 =
           *(undefined2 *)
            (
            "00010203040506070809101112131415161718192021222324252627282930313233343536373839404142434445464748495051525354555657585960616263646566676869707172737475767778798081828384858687888990919293949596979899"
            + (long)out * 2);
    }
    fVar6.end = (char *)(this + in_ECX);
    fVar6.begin = (char *)pdVar3;
    return fVar6;
  }
  fmt::v8::detail::assert_fail
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/external/fmt/include/fmt/format.h"
             ,0x45e,"invalid digit count");
}

Assistant:

FMT_CONSTEXPR20 auto format_decimal(Char* out, UInt value, int size)
    -> format_decimal_result<Char*> {
  FMT_ASSERT(size >= count_digits(value), "invalid digit count");
  out += size;
  Char* end = out;
  while (value >= 100) {
    // Integer division is slow so do it for a group of two digits instead
    // of for every digit. The idea comes from the talk by Alexandrescu
    // "Three Optimization Tips for C++". See speed-test for a comparison.
    out -= 2;
    copy2(out, digits2(static_cast<size_t>(value % 100)));
    value /= 100;
  }
  if (value < 10) {
    *--out = static_cast<Char>('0' + value);
    return {out, end};
  }
  out -= 2;
  copy2(out, digits2(static_cast<size_t>(value)));
  return {out, end};
}